

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::removeUnreferencedResources(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  bVar1 = std::operator==(parameter,"auto");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->remove_unreferenced_page_resources = re_auto;
  }
  else {
    bVar1 = std::operator==(local_18,"yes");
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      peVar2->remove_unreferenced_page_resources = re_yes;
    }
    else {
      bVar1 = std::operator==(local_18,"no");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
        peVar2->remove_unreferenced_page_resources = re_no;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"invalid value for --remove-unreferenced-page-resources",
                   &local_39);
        usage(&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::removeUnreferencedResources(std::string const& parameter)
{
    if (parameter == "auto") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_auto;
    } else if (parameter == "yes") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_yes;
    } else if (parameter == "no") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_no;
    } else {
        usage("invalid value for --remove-unreferenced-page-resources");
    }
    return this;
}